

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O2

void __thiscall
mocker::ir::BuilderContext::BuilderContext
          (BuilderContext *this,ASTIDMap<std::shared_ptr<mocker::ast::Type>_> *exprType,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *doNotTranslate)

{
  FunctionModule *this_00;
  allocator<char> local_17a;
  allocator<char> local_179 [17];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  string local_148;
  string local_128;
  FunctionModule local_108;
  
  (this->logicalExprInfo).empty = true;
  (this->logicalExprInfo).trueNext._M_node = (_List_node_base *)0x0;
  (this->logicalExprInfo).falseNext._M_node = (_List_node_base *)0x0;
  (this->logicalExprInfo).inCondition = false;
  (this->exprAddr)._M_h._M_buckets = &(this->exprAddr)._M_h._M_single_bucket;
  (this->exprAddr)._M_h._M_bucket_count = 1;
  (this->exprAddr)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->exprAddr)._M_h._M_element_count = 0;
  (this->exprAddr)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->exprAddr)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->exprAddr)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->exprType = exprType;
  (this->bbReside)._M_h._M_buckets = &(this->bbReside)._M_h._M_single_bucket;
  (this->bbReside)._M_h._M_bucket_count = 1;
  (this->bbReside)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bbReside)._M_h._M_element_count = 0;
  (this->bbReside)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->bbReside)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bbReside)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  stack<std::shared_ptr<mocker::ir::Label>,std::deque<std::shared_ptr<mocker::ir::Label>,std::allocator<std::shared_ptr<mocker::ir::Label>>>>
  ::
  stack<std::deque<std::shared_ptr<mocker::ir::Label>,std::allocator<std::shared_ptr<mocker::ir::Label>>>,void>
            (&this->loopEntry);
  std::
  stack<std::shared_ptr<mocker::ir::Label>,std::deque<std::shared_ptr<mocker::ir::Label>,std::allocator<std::shared_ptr<mocker::ir::Label>>>>
  ::
  stack<std::deque<std::shared_ptr<mocker::ir::Label>,std::allocator<std::shared_ptr<mocker::ir::Label>>>,void>
            (&this->loopSuccessor);
  std::
  stack<std::shared_ptr<mocker::ir::Label>,std::deque<std::shared_ptr<mocker::ir::Label>,std::allocator<std::shared_ptr<mocker::ir::Label>>>>
  ::
  stack<std::deque<std::shared_ptr<mocker::ir::Label>,std::allocator<std::shared_ptr<mocker::ir::Label>>>,void>
            (&this->loopUpdate);
  (this->classLayout)._M_h._M_buckets = &(this->classLayout)._M_h._M_single_bucket;
  (this->classLayout)._M_h._M_bucket_count = 1;
  (this->classLayout)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->classLayout)._M_h._M_element_count = 0;
  (this->classLayout)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->classLayout)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->classLayout)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->strLits)._M_h._M_buckets = &(this->strLits)._M_h._M_single_bucket;
  (this->strLits)._M_h._M_bucket_count = 1;
  (this->strLits)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->strLits)._M_h._M_element_count = 0;
  (this->strLits)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->strLits)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->strLits)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->trivialExpr)._M_h._M_buckets = &(this->trivialExpr)._M_h._M_single_bucket;
  (this->trivialExpr)._M_h._M_bucket_count = 1;
  (this->trivialExpr)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->trivialExpr)._M_h._M_element_count = 0;
  (this->trivialExpr)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->trivialExpr)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->trivialExpr)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Module::Module(&this->module);
  this->strLitCounter = 0;
  (this->curBasicBlock)._M_node = (_List_node_base *)0x0;
  this->curFunc = (FunctionModule *)0x0;
  this->doNotTranslate = doNotTranslate;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"_init_global_vars",local_179);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"_init_global_vars",&local_17a);
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FunctionModule::FunctionModule(&local_108,&local_148,&local_168,false);
  this_00 = Module::addFunc(&this->module,&local_128,&local_108);
  FunctionModule::~FunctionModule(&local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  FunctionModule::pushBackBB(this_00);
  return;
}

Assistant:

BuilderContext(const ASTIDMap<std::shared_ptr<mocker::ast::Type>> &exprType,
                 const std::unordered_set<ast::NodeID> &doNotTranslate)
      : exprType(exprType), doNotTranslate(doNotTranslate) {
    auto &initGlobalVars = module.addFunc(
        "_init_global_vars", FunctionModule{"_init_global_vars", {}});
    initGlobalVars.pushBackBB();
  }